

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

LogHelper * util::operator<<(LogHelper *h,colour c)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = is_stdout_a_tty();
  if (bVar1) {
    if ((char)c < '\0') {
      poVar2 = std::operator<<(h->screen,"\x1b[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,c & 0x7f);
      std::operator<<(poVar2,";1m");
    }
    else {
      poVar2 = std::operator<<(h->screen,"\x1b[0;");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c);
      std::operator<<(poVar2,'m');
    }
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, colour c)
{
    // Colours are screen only
    if (util::is_stdout_a_tty())
    {
#ifdef _WIN32
        h.screen->flush();
        SetConsoleTextAttribute(GetStdHandle(STD_OUTPUT_HANDLE), static_cast<int>(c));
#else
        auto val = static_cast<int>(c);
        if (val & 0x80)
            *h.screen << "\x1b[" << (val & 0x7f) << ";1m";
        else
            *h.screen << "\x1b[0;" << (val & 0x7f) << 'm';
#endif
    }
    return h;
}